

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.cc
# Opt level: O1

void anon_unknown.dwarf_225e::PrintUsage(ostream *stream)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  
  cVar2 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," sin - generate sinusoidal sequence",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"       sin [ options ] > stdout",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -l l  : output length      (   int)[",0x2b);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"INF",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][   1 <= l <=   ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -m m  : output order       (   int)[",0x2b);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"l-1",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][   0 <= m <=   ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -p p  : period             (double)[",0x2b);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::ostream::_M_insert<double>(10.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 0.0 <  p <=   ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -a a  : amplitude          (double)[",0x2b);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][     <= a <=   ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -o o  : output format      (   int)[",0x2b);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][   0 <= o <= 1 ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 0 (sine)",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 1 (cosine)",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       sinusoidal sequence        (double)",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " sin - generate sinusoidal sequence" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       sin [ options ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : output length      (   int)[" << std::setw(5) << std::right << "INF"                << "][   1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : output order       (   int)[" << std::setw(5) << std::right << "l-1"                << "][   0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -p p  : period             (double)[" << std::setw(5) << std::right << kDefaultPeriod       << "][ 0.0 <  p <=   ]" << std::endl;  // NOLINT
  *stream << "       -a a  : amplitude          (double)[" << std::setw(5) << std::right << kDefaultAmplitude    << "][     <= a <=   ]" << std::endl;  // NOLINT
  *stream << "       -o o  : output format      (   int)[" << std::setw(5) << std::right << kDefaultOutputFormat << "][   0 <= o <= 1 ]" << std::endl;  // NOLINT
  *stream << "                 0 (sine)" << std::endl;
  *stream << "                 1 (cosine)" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       sinusoidal sequence        (double)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}